

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O0

bool __thiscall
duckdb::CatalogSearchPath::SchemaInSearchPath
          (CatalogSearchPath *this,ClientContext *context,string *catalog_name,string *schema_name)

{
  bool bVar1;
  const_iterator l1;
  reference l2;
  __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  *in_RDX;
  long in_RDI;
  ClientContext *in_stack_00000008;
  CatalogSearchEntry *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::CatalogSearchEntry,_true> *__range1;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  local_38;
  long local_30;
  __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
  *local_20;
  
  local_30 = in_RDI + 8;
  local_20 = in_RDX;
  local_38._M_current =
       (CatalogSearchEntry *)
       ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::begin
                 (in_stack_ffffffffffffffa8);
  l1 = ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::end
                 (in_stack_ffffffffffffffa8);
  do {
    bVar1 = __gnu_cxx::
            operator!=<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return false;
    }
    l2 = __gnu_cxx::
         __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
         ::operator*(&local_38);
    bVar1 = StringUtil::CIEquals(&(l1._M_current)->catalog,&l2->catalog);
    if (bVar1) {
      bVar1 = StringUtil::CIEquals(&(l1._M_current)->catalog,&l2->catalog);
      if (bVar1) {
        return true;
      }
      bVar1 = IsInvalidCatalog((string *)0x2a91e9a);
      if (bVar1) {
        in_stack_ffffffffffffffb0 = local_20;
        DatabaseManager::GetDefaultDatabase(in_stack_00000008);
        bVar1 = StringUtil::CIEquals(&(l1._M_current)->catalog,&l2->catalog);
        if (bVar1) {
          return true;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::CatalogSearchEntry_*,_std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

bool CatalogSearchPath::SchemaInSearchPath(ClientContext &context, const string &catalog_name,
                                           const string &schema_name) const {
	for (auto &path : paths) {
		if (!StringUtil::CIEquals(path.schema, schema_name)) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog_name)) {
			return true;
		}
		if (IsInvalidCatalog(path.catalog) &&
		    StringUtil::CIEquals(catalog_name, DatabaseManager::GetDefaultDatabase(context))) {
			return true;
		}
	}
	return false;
}